

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O0

void DictionaryStats::ClearStats(void)

{
  DictionaryStats *pDVar1;
  DictionaryType *pDVar2;
  DictionaryStats *pCurrent;
  DictionaryStats *pNext;
  DictionaryType *type;
  DictionaryType *current;
  
  type = dictionaryTypes;
  while (type != (DictionaryType *)0x0) {
    pCurrent = type->instances;
    while (pCurrent != (DictionaryStats *)0x0) {
      pDVar1 = pCurrent->pNext;
      Memory::
      DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,DictionaryStats>
                ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,pCurrent);
      pCurrent = pDVar1;
    }
    pDVar2 = type->pNext;
    Memory::
    DeleteObject<Memory::NoCheckHeapAllocator,(Memory::AllocatorDeleteFlags)0,DictionaryType>
              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,type);
    type = pDVar2;
  }
  dictionaryTypes = (DictionaryType *)0x0;
  return;
}

Assistant:

void DictionaryStats::ClearStats()
{
    // Clear the collection since we already reported on what we already collected
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        DictionaryType *type = current;
        DictionaryStats *pNext = type->instances;
        while(pNext)
        {
            DictionaryStats *pCurrent = pNext;
            pNext = pNext->pNext;
            NoCheckHeapDelete(pCurrent);
        }
        current = current->pNext;
        NoCheckHeapDelete(type);
    }
    dictionaryTypes = NULL;
}